

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton button,float lock_threshold)

{
  bool bVar1;
  int in_EDI;
  float in_XMM0_Da;
  ImGuiContext *g;
  ImGuiContext *lhs;
  float local_10;
  ImVec2 local_8;
  
  local_10 = in_XMM0_Da;
  if (in_XMM0_Da < 0.0) {
    local_10 = (GImGui->IO).MouseDragThreshold;
  }
  if ((((((GImGui->IO).MouseDown[in_EDI] & 1U) == 0) &&
       (((GImGui->IO).MouseReleased[in_EDI] & 1U) == 0)) ||
      ((GImGui->IO).MouseDragMaxDistanceSqr[in_EDI] < local_10 * local_10)) ||
     ((lhs = GImGui, bVar1 = IsMousePosValid(&(GImGui->IO).MousePos), !bVar1 ||
      (bVar1 = IsMousePosValid((lhs->IO).MouseClickedPos + in_EDI), !bVar1)))) {
    ImVec2::ImVec2(&local_8,0.0,0.0);
  }
  else {
    local_8 = ::operator-((ImVec2 *)lhs,(ImVec2 *)0x4eaf9f);
  }
  return local_8;
}

Assistant:

ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    if (g.IO.MouseDown[button] || g.IO.MouseReleased[button])
        if (g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold)
            if (IsMousePosValid(&g.IO.MousePos) && IsMousePosValid(&g.IO.MouseClickedPos[button]))
                return g.IO.MousePos - g.IO.MouseClickedPos[button];
    return ImVec2(0.0f, 0.0f);
}